

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O1

MPP_RET mpp_buffer_detach_dev_f(char *caller,MppBuffer buffer,MppDev dev)

{
  long *plVar1;
  long *plVar2;
  MPP_RET MVar3;
  long *param;
  
  MVar3 = MPP_OK;
  mpp_dev_ioctl(dev,0xb,(void *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)((long)buffer + 0x28));
  plVar1 = *(long **)((long)buffer + 0xd8);
  do {
    param = plVar1;
    if (param == (long *)((long)buffer + 0xd8)) goto LAB_0015abe8;
    plVar1 = (long *)*param;
  } while ((MppDev)param[4] != dev);
  plVar2 = (long *)param[1];
  plVar1[1] = (long)plVar2;
  *plVar2 = (long)plVar1;
  *param = (long)param;
  param[1] = (long)param;
  MVar3 = mpp_dev_ioctl(dev,0xe,param);
  mpp_mem_pool_put_f(caller,mpp_buf_map_node_pool,param);
LAB_0015abe8:
  pthread_mutex_unlock((pthread_mutex_t *)((long)buffer + 0x28));
  mpp_dev_ioctl(dev,0xc,(void *)0x0);
  return MVar3;
}

Assistant:

MPP_RET mpp_buffer_detach_dev_f(const char *caller, MppBuffer buffer, MppDev dev)
{
    MppBufferImpl *impl = (MppBufferImpl *)buffer;
    MppDevBufMapNode *pos, *n;
    MPP_RET ret = MPP_OK;

    mpp_dev_ioctl(dev, MPP_DEV_LOCK_MAP, NULL);
    pthread_mutex_lock(&impl->lock);
    list_for_each_entry_safe(pos, n, &impl->list_maps, MppDevBufMapNode, list_buf) {
        if (pos->dev == dev) {
            list_del_init(&pos->list_buf);
            ret = mpp_dev_ioctl(dev, MPP_DEV_DETACH_FD, pos);
            mpp_mem_pool_put_f(caller, mpp_buf_map_node_pool, pos);
            break;
        }
    }
    pthread_mutex_unlock(&impl->lock);
    mpp_dev_ioctl(dev, MPP_DEV_UNLOCK_MAP, NULL);

    return ret;
}